

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.h
# Opt level: O2

Analysis __thiscall
spvtools::opt::EliminateDeadMembersPass::GetPreservedAnalyses(EliminateDeadMembersPass *this)

{
  return kAnalysisIdToFuncMapping|kAnalysisBuiltinVarId|kAnalysisStructuredCFG|
         kAnalysisValueNumberTable|kAnalysisRegisterPressure|kAnalysisScalarEvolution|
         kAnalysisLoopAnalysis|kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisCombinators|
         kAnalysisInstrToBlockMapping|kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisRegisterPressure |
           IRContext::kAnalysisValueNumberTable |
           IRContext::kAnalysisStructuredCFG |
           IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisIdToFuncMapping;
  }